

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# failure_test.cxx
# Opt level: O1

ReturnCode
failure_test::ool_detect_cb(atomic<bool> *invoked,size_t purge_upto,Type type,Param *params)

{
  long lVar1;
  _func_int **pp_Var2;
  code cVar3;
  ostream *poVar4;
  _func_int *p_Var5;
  pthread_t local_50;
  char *local_48;
  long local_40;
  char local_38 [16];
  
  if (type == OutOfLogRangeWarning) {
    lVar1 = *params->ctx;
    if (purge_upto + 1 != lVar1) {
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
      std::ostream::put(-0x70);
      poVar4 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"        time: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\x1b[1;30m",7);
      TestSuite::getTimeString_abi_cxx11_();
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_48,local_40);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\x1b[0m",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"      thread: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\x1b[33m",5);
      pp_Var2 = poVar4->_vptr_basic_ostream;
      *(uint *)(&poVar4->field_0x18 + (long)pp_Var2[-3]) =
           *(uint *)(&poVar4->field_0x18 + (long)pp_Var2[-3]) & 0xffffffb5 | 8;
      *(undefined8 *)(&poVar4->field_0x10 + (long)pp_Var2[-3]) = 4;
      p_Var5 = (_func_int *)((long)&poVar4->_vptr_basic_ostream + (long)pp_Var2[-3]);
      if ((&poVar4->field_0xe1)[(long)pp_Var2[-3]] == '\0') {
        cVar3 = (code)std::ios::widen((char)p_Var5);
        p_Var5[0xe0] = cVar3;
        p_Var5[0xe1] = (code)0x1;
      }
      p_Var5[0xe0] = (code)0x30;
      local_50 = pthread_self();
      std::_Hash_bytes(&local_50,8,0xc70f6907);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      *(uint *)(&poVar4->field_0x18 + (long)poVar4->_vptr_basic_ostream[-3]) =
           *(uint *)(&poVar4->field_0x18 + (long)poVar4->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\x1b[0m",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"          in: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\x1b[36m",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"operator()",10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"()\x1b[0m",6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"          at: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\x1b[32m",5);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/failure_test.cxx"
                 ,0x66);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\x1b[0m:",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\x1b[1;35m",7);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x106);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\x1b[0m",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"    value of: \x1b[1;34mool_args->startIdxOfLeader\x1b[0m\n",0x34);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"    expected: \x1b[1;32m",0x15);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\x1b[0m\n",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"      actual: \x1b[1;31m",0x15);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\x1b[0m\n",5);
      if (local_48 != local_38) {
        operator_delete(local_48);
      }
      TestSuite::failHandler();
      if (purge_upto + 1 != lVar1) {
        return Ok;
      }
    }
    LOCK();
    (invoked->_M_base)._M_i = true;
    UNLOCK();
  }
  else {
    cb_default(type,params);
  }
  return Ok;
}

Assistant:

cb_func::ReturnCode ool_detect_cb(std::atomic<bool>* invoked,
                                  size_t purge_upto,
                                  cb_func::Type type,
                                  cb_func::Param* params)
{
    if (type == cb_func::Type::OutOfLogRangeWarning) {
        cb_func::OutOfLogRangeWarningArgs* ool_args =
            (cb_func::OutOfLogRangeWarningArgs*)params->ctx;
        auto chk_func = [purge_upto, ool_args]() -> int {
            CHK_EQ(purge_upto + 1, ool_args->startIdxOfLeader);
            return 0;
        };
        if (chk_func() == 0) {
            invoked->store(true);
        }
    } else {
        return cb_default(type, params);
    }

    return cb_func::ReturnCode::Ok;
}